

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.h
# Opt level: O3

void __thiscall
chrono::ChBodyEasyClusterOfSpheres::~ChBodyEasyClusterOfSpheres(ChBodyEasyClusterOfSpheres *this)

{
  ChBody::~ChBody(&this->super_ChBody,&PTR_construction_vtable_24__00b08dc0);
  free(*(void **)&this[-1].super_ChBody.bflags);
  return;
}

Assistant:

class ChApi ChBodyEasyClusterOfSpheres : public ChBody {
  public:
    /// Create a ChBody with optional sphere cluster mesh visualization and/or collision shapes. The cluster of spheres
    /// will be displaced so that their center of mass corresponds to the origin of the ChBody. Mass and inertia are set
    /// automatically depending on density.
    ChBodyEasyClusterOfSpheres(std::vector<ChVector<>>& positions,                     ///< position of the spheres
                               std::vector<double>& radii,                             ///< sphere radius
                               double density,                                         ///< density of the body
                               bool visualize = true,                                  ///< create visualization asset
                               bool collide = false,                                   ///< enable collision
                               std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                               std::shared_ptr<collision::ChCollisionModel> collision_model =
                                   chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBody with a sphere cluster mesh visualization and collision shapes using the specified collision
    /// model type. The cluster of spheres will be displaced so that their center of mass corresponds to the origin of
    /// the ChBody. Mass and inertia are set automatically depending on density.
    ChBodyEasyClusterOfSpheres(std::vector<ChVector<>>& positions,              ///< position of the spheres
                               std::vector<double>& radii,                      ///< sphere radius
                               double density,                                  ///< density of the body
                               std::shared_ptr<ChMaterialSurface> material,     ///< surface contact material
                               collision::ChCollisionSystemType collision_type  ///< collision model type
    );

  private:
    void SetupBody(std::vector<ChVector<>>& positions,
                   std::vector<double>& radii,
                   double density,
                   bool visualize,
                   bool collide,
                   std::shared_ptr<ChMaterialSurface> material);
}